

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmXMLWriter.cxx
# Opt level: O0

void __thiscall cmXMLWriter::StartElement(cmXMLWriter *this,string *name)

{
  ostream *poVar1;
  string *name_local;
  cmXMLWriter *this_local;
  
  CloseStartElement(this);
  ConditionalLineBreak(this,(bool)((this->IsContent ^ 0xffU) & 1));
  poVar1 = std::operator<<(this->Output,'<');
  std::operator<<(poVar1,(string *)name);
  std::
  stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::push(&this->Elements,name);
  this->Indent = this->Indent + 1;
  this->ElementOpen = true;
  this->BreakAttrib = false;
  return;
}

Assistant:

void cmXMLWriter::StartElement(std::string const& name)
{
  this->CloseStartElement();
  this->ConditionalLineBreak(!this->IsContent);
  this->Output << '<' << name;
  this->Elements.push(name);
  ++this->Indent;
  this->ElementOpen = true;
  this->BreakAttrib = false;
}